

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::BeginReadDictionary
          (ON_BinaryArchive *this,ON_UUID *dictionary_id,uint *version,ON_wString *dictionary_name)

{
  bool bVar1;
  bool bVar2;
  int major_version;
  int minor_version;
  ON_UUID id;
  int local_40 [2];
  ON_UUID local_38;
  
  local_40[0] = 0;
  local_40[1] = 0;
  bVar1 = BeginRead3dmChunk(this,0x40008010,local_40,local_40 + 1);
  if (!bVar1) {
    return false;
  }
  if ((local_40[0] != 1) ||
     (bVar1 = BeginRead3dmChunk(this,0x40008011,local_40,local_40 + 1), !bVar1)) goto LAB_003cbc70;
  if ((local_40[0] == 1) && (bVar1 = ReadUuid(this,&local_38), bVar1)) {
    if (dictionary_id != (ON_UUID *)0x0) {
      dictionary_id->Data1 = local_38.Data1;
      dictionary_id->Data2 = local_38.Data2;
      dictionary_id->Data3 = local_38.Data3;
      *&dictionary_id->Data4 = local_38.Data4;
    }
    bVar1 = ReadInt(this,version);
    if (!bVar1) goto LAB_003cbc5d;
    bVar1 = ReadString(this,dictionary_name);
  }
  else {
LAB_003cbc5d:
    bVar1 = false;
  }
  bVar2 = EndRead3dmChunk(this);
  if ((bVar1 & bVar2) != 0) {
    return true;
  }
LAB_003cbc70:
  EndRead3dmChunk(this);
  return false;
}

Assistant:

bool ON_BinaryArchive::BeginReadDictionary(
        ON_UUID* dictionary_id,
        unsigned int* version,
        ON_wString& dictionary_name
        )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = BeginRead3dmChunk(TCODE_DICTIONARY,&major_version,&minor_version);
  if ( rc )
  {
    for(;;)
    {
      rc = (1 == major_version);
      if (!rc) break;

      // Read dictionary id chunk
      rc = BeginRead3dmChunk(TCODE_DICTIONARY_ID,&major_version,&minor_version);
      if ( !rc ) break;
      for(;;)
      {
        rc = (1==major_version);
        if (!rc) break;
        ON_UUID id;
        rc = ReadUuid(id);
        if (!rc) break;
        if ( dictionary_id )
          *dictionary_id = id;
        rc = ReadInt(version);
        if (!rc) break;
        rc = ReadString(dictionary_name);
        if (!rc) break;
        break;
      }
      if ( !EndRead3dmChunk() ) // TCODE_DICTIONARY_ID end
        rc = false;
      break;
    }

    if ( !rc )
      EndRead3dmChunk(); // TCODE_DICTIONARY end
  }
  return rc;
}